

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

Gia_Man_t * Gia_ManPerformMappingInt(Gia_Man_t *p,If_Par_t *pPars)

{
  char cVar1;
  int iVar2;
  int iVar3;
  If_Man_t *pIfMan_00;
  If_DsdMan_t *pIVar4;
  Tim_Man_t *pTVar5;
  char *pcVar6;
  If_Par_t *pIVar7;
  bool local_41;
  If_DsdMan_t *p_1;
  If_Man_t *pIfMan;
  Gia_Man_t *pNew;
  If_Par_t *pPars_local;
  Gia_Man_t *p_local;
  
  if (pPars->pTimesArr != (float *)0x0) {
    __assert_fail("pPars->pTimesArr == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                  ,0x843,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
  }
  if (pPars->pTimesReq != (float *)0x0) {
    __assert_fail("pPars->pTimesReq == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                  ,0x844,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
  }
  if (p->pCellStr != (char *)0x0) {
    free(p->pCellStr);
    p->pCellStr = (char *)0x0;
  }
  Vec_IntFreeP(&p->vConfigs);
  if ((((pPars->fDelayOpt == 0) && (pPars->fDelayOptLut == 0)) && (pPars->fDsdBalance == 0)) &&
     (((pPars->fUserRecLib == 0 && (pPars->fDeriveLuts == 0)) &&
      ((pPars->fUseDsd == 0 && (pPars->fUseTtPerm == 0)))))) {
    pPars->fCutMin = 0;
  }
  pIfMan_00 = Gia_ManToIf(p,pPars);
  if (pIfMan_00 == (If_Man_t *)0x0) {
    p_local = (Gia_Man_t *)0x0;
  }
  else {
    if (pPars->fUseDsd != 0) {
      pIVar4 = (If_DsdMan_t *)Abc_FrameReadManDsd();
      iVar3 = pPars->nLutSize;
      iVar2 = If_DsdManVarNum(pIVar4);
      if (iVar2 < iVar3) {
        __assert_fail("pPars->nLutSize <= If_DsdManVarNum(p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                      ,0x852,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
      }
      if (((pPars->pLutStruct != (char *)0x0) || (iVar3 = If_DsdManLutSize(pIVar4), iVar3 != 0)) &&
         ((pPars->pLutStruct == (char *)0x0 ||
          (cVar1 = *pPars->pLutStruct, iVar3 = If_DsdManLutSize(pIVar4), cVar1 + -0x30 != iVar3))))
      {
        __assert_fail("(pPars->pLutStruct == NULL && If_DsdManLutSize(p) == 0) || (pPars->pLutStruct && pPars->pLutStruct[0] - \'0\' == If_DsdManLutSize(p))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                      ,0x853,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
      }
      pIVar4 = (If_DsdMan_t *)Abc_FrameReadManDsd();
      pIfMan_00->pIfDsdMan = pIVar4;
      if (pPars->fDsdBalance != 0) {
        If_DsdManAllocIsops(pIfMan_00->pIfDsdMan,pPars->nLutSize);
      }
    }
    if (pPars->fPower != 0) {
      if (p->pManTime == (void *)0x0) {
        If_ManComputeSwitching(pIfMan_00);
      }
      else {
        Abc_Print(0,"Switching activity computation for designs with boxes is disabled.\n");
      }
    }
    if (p->pManTime != (void *)0x0) {
      local_41 = true;
      if (((pPars->fDelayOpt == 0) && (local_41 = true, pPars->fDelayOptLut == 0)) &&
         (local_41 = true, pPars->fDsdBalance == 0)) {
        local_41 = pPars->fUserRecLib != 0;
      }
      pTVar5 = Tim_ManDup((Tim_Man_t *)p->pManTime,(uint)local_41);
      pIfMan_00->pManTim = pTVar5;
    }
    iVar3 = If_ManPerformMapping(pIfMan_00);
    if (iVar3 == 0) {
      If_ManStop(pIfMan_00);
      p_local = (Gia_Man_t *)0x0;
    }
    else {
      if (((pIfMan_00->pPars->fDelayOpt == 0) && (pIfMan_00->pPars->fDsdBalance == 0)) &&
         (pIfMan_00->pPars->fUserRecLib == 0)) {
        pIfMan = (If_Man_t *)Gia_ManFromIfLogic(pIfMan_00);
      }
      else {
        pIfMan = (If_Man_t *)Gia_ManFromIfAig(pIfMan_00);
      }
      If_ManStop(pIfMan_00);
      if (pIfMan->pName != (char *)0x0) {
        __assert_fail("pNew->pName == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                      ,0x86f,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
      }
      pcVar6 = Abc_UtilStrsav(p->pName);
      pIfMan->pName = pcVar6;
      pIVar7 = (If_Par_t *)Abc_UtilStrsav(p->pSpec);
      pIfMan->pPars = pIVar7;
      iVar3 = Gia_ManRegNum(p);
      Gia_ManSetRegNum((Gia_Man_t *)pIfMan,iVar3);
      p_local = (Gia_Man_t *)pIfMan;
    }
  }
  return p_local;
}

Assistant:

Gia_Man_t * Gia_ManPerformMappingInt( Gia_Man_t * p, If_Par_t * pPars )
{
    extern void Gia_ManIffTest( Gia_Man_t * pGia, If_LibLut_t * pLib, int fVerbose );
    Gia_Man_t * pNew;
    If_Man_t * pIfMan;
    assert( pPars->pTimesArr == NULL );
    assert( pPars->pTimesReq == NULL );
    ABC_FREE( p->pCellStr );
    Vec_IntFreeP( &p->vConfigs );
    // disable cut minimization when GIA strucure is needed
    if ( !pPars->fDelayOpt && !pPars->fDelayOptLut && !pPars->fDsdBalance && !pPars->fUserRecLib && !pPars->fDeriveLuts && !pPars->fUseDsd && !pPars->fUseTtPerm )
        pPars->fCutMin = 0;
    // translate into the mapper
    pIfMan = Gia_ManToIf( p, pPars );    
    if ( pIfMan == NULL )
        return NULL;
    // create DSD manager
    if ( pPars->fUseDsd )
    {
        If_DsdMan_t * p = (If_DsdMan_t *)Abc_FrameReadManDsd();
        assert( pPars->nLutSize <= If_DsdManVarNum(p) );
        assert( (pPars->pLutStruct == NULL && If_DsdManLutSize(p) == 0) || (pPars->pLutStruct && pPars->pLutStruct[0] - '0' == If_DsdManLutSize(p)) );
        pIfMan->pIfDsdMan = (If_DsdMan_t *)Abc_FrameReadManDsd();
        if ( pPars->fDsdBalance )
            If_DsdManAllocIsops( pIfMan->pIfDsdMan, pPars->nLutSize );
    }
    // compute switching for the IF objects
    if ( pPars->fPower )
    {
        if ( p->pManTime == NULL )
            If_ManComputeSwitching( pIfMan );
        else
            Abc_Print( 0, "Switching activity computation for designs with boxes is disabled.\n" );
    }
    if ( p->pManTime )
        pIfMan->pManTim = Tim_ManDup( (Tim_Man_t *)p->pManTime, pPars->fDelayOpt || pPars->fDelayOptLut || pPars->fDsdBalance || pPars->fUserRecLib );
//	Tim_ManPrint( pIfMan->pManTim );
    if ( !If_ManPerformMapping( pIfMan ) )
    {
        If_ManStop( pIfMan );
        return NULL;
    }
    // transform the result of mapping into the new network
    if ( pIfMan->pPars->fDelayOpt || pIfMan->pPars->fDsdBalance || pIfMan->pPars->fUserRecLib )
        pNew = Gia_ManFromIfAig( pIfMan );
    else
        pNew = Gia_ManFromIfLogic( pIfMan );
    If_ManStop( pIfMan );
    // transfer name
    assert( pNew->pName == NULL );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}